

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_begin_2d(rf_camera2d camera)

{
  rf_camera2d camera_00;
  rf_mat mat;
  rf_mat mat_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined8 in_stack_ffffffffffffff28;
  float local_c8 [18];
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48 [16];
  
  rf_gfx_draw();
  rf_gfx_load_identity();
  uVar15._0_4_ = (rf__ctx->field_0).screen_scaling.m9;
  uVar15._4_4_ = (rf__ctx->field_0).screen_scaling.m13;
  uVar1 = (rf__ctx->field_0).screen_scaling.m8;
  uVar2 = (rf__ctx->field_0).screen_scaling.m12;
  uVar3 = (rf__ctx->field_0).screen_scaling.m1;
  uVar4 = (rf__ctx->field_0).screen_scaling.m5;
  uVar5 = (rf__ctx->field_0).screen_scaling.m9;
  uVar6 = (rf__ctx->field_0).screen_scaling.m13;
  uVar7 = (rf__ctx->field_0).screen_scaling.m2;
  uVar8 = (rf__ctx->field_0).screen_scaling.m6;
  uVar9 = (rf__ctx->field_0).screen_scaling.m10;
  uVar10 = (rf__ctx->field_0).screen_scaling.m14;
  uVar11 = (rf__ctx->field_0).screen_scaling.m3;
  uVar12 = (rf__ctx->field_0).screen_scaling.m7;
  uVar13 = (rf__ctx->field_0).screen_scaling.m11;
  uVar14 = (rf__ctx->field_0).screen_scaling.m15;
  mat.m7 = (float)uVar14;
  mat.m3 = (float)uVar13;
  mat.m14 = (float)uVar12;
  mat.m10 = (float)uVar11;
  mat.m6 = (float)uVar10;
  mat.m2 = (float)uVar9;
  mat.m13 = (float)uVar8;
  mat.m9 = (float)uVar7;
  mat.m5 = (float)uVar6;
  mat.m1 = (float)uVar5;
  mat.m12 = (float)uVar4;
  mat.m8 = (float)uVar3;
  mat.m4 = (float)uVar2;
  mat.m0 = (float)uVar1;
  mat.m11 = (float)(int)in_stack_ffffffffffffff28;
  mat.m15 = (float)(int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  rf_mat_to_float16(mat);
  rf_gfx_mult_matrixf(local_48);
  camera_00.rotation = (float)(int)uVar15;
  camera_00.zoom = (float)(int)((ulong)uVar15 >> 0x20);
  camera_00.offset = camera.offset;
  camera_00.target = camera.target;
  rf_get_camera_matrix2d(camera_00);
  mat_00.m8 = (float)(undefined4)local_78;
  mat_00.m12 = (float)local_78._4_4_;
  mat_00.m0 = (float)(undefined4)uStack_80;
  mat_00.m4 = (float)uStack_80._4_4_;
  mat_00.m1 = (float)(undefined4)uStack_70;
  mat_00.m5 = (float)uStack_70._4_4_;
  mat_00.m9 = (float)(undefined4)local_68;
  mat_00.m13 = (float)local_68._4_4_;
  mat_00.m2 = (float)(undefined4)uStack_60;
  mat_00.m6 = (float)uStack_60._4_4_;
  mat_00.m10 = (float)(undefined4)local_58;
  mat_00.m14 = (float)local_58._4_4_;
  mat_00.m3 = (float)(undefined4)uStack_50;
  mat_00.m7 = (float)uStack_50._4_4_;
  mat_00.m11 = (float)(int)in_stack_ffffffffffffff28;
  mat_00.m15 = (float)(int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  rf_mat_to_float16(mat_00);
  rf_gfx_mult_matrixf(local_c8);
  return;
}

Assistant:

RF_API void rf_begin_2d(rf_camera2d camera)
{
    rf_gfx_draw();

    rf_gfx_load_identity(); // Reset current matrix (MODELVIEW)

    // Apply screen scaling if required
    rf_gfx_mult_matrixf(rf_mat_to_float16(rf_ctx.screen_scaling).v);

    // Apply 2d camera transformation to rf_gfxobal_model_view
    rf_gfx_mult_matrixf(rf_mat_to_float16(rf_get_camera_matrix2d(camera)).v);
}